

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void __thiscall
embree::SceneGraph::TransformNode::print(TransformNode *this,ostream *cout,int depth)

{
  ostream *poVar1;
  void *pvVar2;
  int in_EDX;
  ostream *in_RSI;
  void *in_RDI;
  int n;
  undefined4 in_stack_ffffffffffffffd0;
  
  poVar1 = std::operator<<(in_RSI,"TransformNode @ ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI);
  poVar1 = std::operator<<(poVar1," { ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  n = (int)((ulong)in_RDI >> 0x20);
  tab((ostream *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),n);
  poVar1 = std::operator<<(in_RSI,"closed = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(bool)(*(byte *)((long)in_RDI + 0x58) & 1));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  tab((ostream *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),n);
  poVar1 = std::operator<<(in_RSI,"numTimeSteps = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(ulong *)((long)in_RDI + 0x78));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  tab((ostream *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),n);
  std::operator<<(in_RSI,"child = ");
  (**(code **)(**(long **)((long)in_RDI + 0x98) + 0x20))
            (*(long **)((long)in_RDI + 0x98),in_RSI,in_EDX + 1);
  tab((ostream *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),n);
  poVar1 = std::operator<<(in_RSI,"}");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void SceneGraph::TransformNode::print(std::ostream& cout, int depth)
  {
    cout << "TransformNode @ " << this << " { " << std::endl;
    tab(cout, depth+1); cout << "closed = " << closed << std::endl;
    tab(cout, depth+1); cout << "numTimeSteps = " << spaces.size() << std::endl;
    tab(cout, depth+1); cout << "child = "; child->print(cout,depth+1);
    tab(cout, depth); cout << "}" << std::endl;
  }